

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceCubeFaceCoord
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  undefined4 uVar1;
  uint32_t uVar2;
  Analysis AVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  TypeManager *this;
  ConstantManager *this_00;
  Type *type;
  FeatureManager *pFVar7;
  Constant *c;
  Instruction *pIVar8;
  uint32_t local_4b4;
  iterator local_4b0;
  undefined8 local_4a8;
  SmallVector<unsigned_int,_2UL> local_4a0;
  Operand local_478;
  uint32_t local_444;
  iterator local_440;
  undefined8 local_438;
  SmallVector<unsigned_int,_2UL> local_430;
  Operand local_408;
  undefined1 local_3d8 [8];
  OperandList new_operands;
  Instruction *div;
  uint32_t local_3b0;
  uint32_t local_3ac;
  iterator local_3a8;
  size_type local_3a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_398;
  Instruction *local_380;
  Instruction *denom;
  uint32_t local_370;
  uint32_t local_36c;
  iterator local_368;
  size_type local_360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  Instruction *local_340;
  Instruction *cube;
  Instruction *cubetc;
  Instruction *cubetc_case_1;
  Instruction *cubesc;
  Instruction *sel;
  Instruction *cubesc_case_2;
  Instruction *cubesc_case_1;
  Instruction *is_y_max;
  Instruction *y_gr_x;
  Instruction *not_is_z_max;
  Instruction *is_z_max;
  Instruction *cubema;
  uint32_t local_2d8;
  uint32_t local_2d4;
  iterator local_2d0;
  size_type local_2c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2c0;
  Instruction *local_2a8;
  Instruction *amax;
  uint32_t local_298;
  uint32_t local_294;
  iterator local_290;
  size_type local_288;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_280;
  Instruction *local_268;
  Instruction *amax_x_y;
  Instruction *is_x_neg;
  Instruction *is_y_neg;
  Instruction *is_z_neg;
  iterator local_240;
  size_type local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_230;
  Instruction *local_218;
  Instruction *az;
  iterator local_208;
  size_type local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  Instruction *local_1e0;
  Instruction *ay;
  iterator local_1d0;
  size_type local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  Instruction *local_1a8;
  Instruction *ax;
  Instruction *nz;
  Instruction *ny;
  Instruction *nx;
  iterator local_180;
  size_type local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  Instruction *local_158;
  Instruction *z;
  iterator local_148;
  size_type local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  Instruction *local_120;
  Instruction *y;
  iterator local_110;
  size_type local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  Instruction *local_e8;
  Instruction *x;
  uint32_t vec_const_id;
  uint32_t local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  Constant *local_a8;
  Constant *vec_const;
  uint32_t f0_5_const_id;
  uint32_t f2_const_id;
  uint32_t f0_const_id;
  uint32_t local_70;
  uint32_t local_6c;
  uint32_t glsl405_ext_inst_id;
  uint32_t input_id;
  InstructionBuilder ir_builder;
  uint32_t bool_id;
  uint32_t v2_float_type_id;
  Type *v2_float_type;
  uint32_t float_type_id;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  this = IRContext::get_type_mgr(ctx);
  this_00 = IRContext::get_constant_mgr(ctx);
  uVar2 = analysis::TypeManager::GetFloatTypeId(this);
  type = analysis::TypeManager::GetFloatVectorType(this,2);
  ir_builder._28_4_ = analysis::TypeManager::GetId(this,type);
  ir_builder.preserved_analyses_ = analysis::TypeManager::GetBoolTypeId(this);
  AVar3 = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)&glsl405_ext_inst_id,ctx,inst,AVar3);
  local_6c = opt::Instruction::GetSingleWordInOperand(inst,2);
  pFVar7 = IRContext::get_feature_mgr(ctx);
  local_70 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar7);
  if (local_70 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&f0_const_id,"GLSL.std.450",(allocator<char> *)((long)&f2_const_id + 3));
    IRContext::AddExtInstImport(ctx,(string *)&f0_const_id);
    std::__cxx11::string::~string((string *)&f0_const_id);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f2_const_id + 3));
    pFVar7 = IRContext::get_feature_mgr(ctx);
    local_70 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar7);
  }
  f0_5_const_id = analysis::ConstantManager::GetFloatConstId(this_00,0.0);
  vec_const._4_4_ = analysis::ConstantManager::GetFloatConstId(this_00,2.0);
  vec_const_id = analysis::ConstantManager::GetFloatConstId(this_00,0.5);
  local_d0 = &vec_const_id;
  local_c8 = 2;
  local_d4 = vec_const_id;
  vec_const._0_4_ = vec_const_id;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&x + 7));
  __l_09._M_len = local_c8;
  __l_09._M_array = local_d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__l_09,(allocator_type *)((long)&x + 7));
  c = analysis::ConstantManager::GetConstant(this_00,type,&local_c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_c0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&x + 7));
  local_a8 = c;
  pIVar8 = analysis::ConstantManager::GetDefiningInstruction(this_00,c,0,(inst_iterator *)0x0);
  x._0_4_ = opt::Instruction::result_id(pIVar8);
  uVar4 = local_6c;
  y._4_4_ = 0;
  local_110 = (iterator)((long)&y + 4);
  local_108 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&y + 3));
  __l_08._M_len = local_108;
  __l_08._M_array = local_110;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_100,__l_08,(allocator_type *)((long)&y + 3));
  pIVar8 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,&local_100);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&y + 3));
  uVar4 = local_6c;
  z._4_4_ = 1;
  local_148 = (iterator)((long)&z + 4);
  local_140 = 1;
  local_e8 = pIVar8;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&z + 3));
  __l_07._M_len = local_140;
  __l_07._M_array = local_148;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_138,__l_07,(allocator_type *)((long)&z + 3));
  pIVar8 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,&local_138);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&z + 3));
  uVar4 = local_6c;
  nx._4_4_ = 2;
  local_180 = (iterator)((long)&nx + 4);
  local_178 = 1;
  local_120 = pIVar8;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&nx + 3));
  __l_06._M_len = local_178;
  __l_06._M_array = local_180;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_170,__l_06,(allocator_type *)((long)&nx + 3));
  pIVar8 = InstructionBuilder::AddCompositeExtract
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,&local_170);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&nx + 3));
  local_158 = pIVar8;
  uVar4 = opt::Instruction::result_id(local_e8);
  ny = InstructionBuilder::AddUnaryOp
                 ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,OpFNegate,uVar4);
  uVar4 = opt::Instruction::result_id(local_120);
  nz = InstructionBuilder::AddUnaryOp
                 ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,OpFNegate,uVar4);
  uVar4 = opt::Instruction::result_id(local_158);
  ax = InstructionBuilder::AddUnaryOp
                 ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,OpFNegate,uVar4);
  uVar4 = local_70;
  ay._4_4_ = opt::Instruction::result_id(local_e8);
  local_1d0 = (iterator)((long)&ay + 4);
  local_1c8 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&ay + 3));
  __l_05._M_len = local_1c8;
  __l_05._M_array = local_1d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1c0,__l_05,(allocator_type *)((long)&ay + 3));
  pIVar8 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,4,&local_1c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&ay + 3));
  uVar4 = local_70;
  local_1a8 = pIVar8;
  az._4_4_ = opt::Instruction::result_id(local_120);
  local_208 = (iterator)((long)&az + 4);
  local_200 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&az + 3));
  __l_04._M_len = local_200;
  __l_04._M_array = local_208;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1f8,__l_04,(allocator_type *)((long)&az + 3));
  pIVar8 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,4,&local_1f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1f8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&az + 3));
  uVar4 = local_70;
  local_1e0 = pIVar8;
  is_z_neg._4_4_ = opt::Instruction::result_id(local_158);
  local_240 = (iterator)((long)&is_z_neg + 4);
  local_238 = 1;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&is_z_neg + 3));
  __l_03._M_len = local_238;
  __l_03._M_array = local_240;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_230,__l_03,(allocator_type *)((long)&is_z_neg + 3));
  pIVar8 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,4,&local_230);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_230);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&is_z_neg + 3));
  AVar3 = ir_builder.preserved_analyses_;
  local_218 = pIVar8;
  uVar4 = opt::Instruction::result_id(local_158);
  is_y_neg = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpFOrdLessThan,uVar4,
                        f0_5_const_id);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(local_120);
  is_x_neg = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpFOrdLessThan,uVar4,
                        f0_5_const_id);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(local_e8);
  amax_x_y = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpFOrdLessThan,uVar4,
                        f0_5_const_id);
  uVar4 = local_70;
  local_298 = opt::Instruction::result_id(local_1a8);
  local_294 = opt::Instruction::result_id(local_1e0);
  local_290 = &local_298;
  local_288 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&amax + 7));
  __l_02._M_len = local_288;
  __l_02._M_array = local_290;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_280,__l_02,(allocator_type *)((long)&amax + 7));
  pIVar8 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,0x28,&local_280);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_280);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&amax + 7));
  uVar4 = local_70;
  local_268 = pIVar8;
  local_2d8 = opt::Instruction::result_id(local_218);
  local_2d4 = opt::Instruction::result_id(local_268);
  local_2d0 = &local_2d8;
  local_2c8 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&cubema + 7));
  __l_01._M_len = local_2c8;
  __l_01._M_array = local_2d0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_2c0,__l_01,(allocator_type *)((long)&cubema + 7));
  pIVar8 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,0x28,&local_2c0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2c0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&cubema + 7));
  uVar4 = vec_const._4_4_;
  local_2a8 = pIVar8;
  uVar5 = opt::Instruction::result_id(pIVar8);
  is_z_max = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,OpFMul,uVar4,uVar5);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(local_218);
  uVar5 = opt::Instruction::result_id(local_268);
  not_is_z_max = InstructionBuilder::AddBinaryOp
                           ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpFOrdGreaterThanEqual,
                            uVar4,uVar5);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(not_is_z_max);
  y_gr_x = InstructionBuilder::AddUnaryOp
                     ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpLogicalNot,uVar4);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(local_1e0);
  uVar5 = opt::Instruction::result_id(local_1a8);
  is_y_max = InstructionBuilder::AddBinaryOp
                       ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpFOrdGreaterThanEqual,
                        uVar4,uVar5);
  AVar3 = ir_builder.preserved_analyses_;
  uVar4 = opt::Instruction::result_id(y_gr_x);
  uVar5 = opt::Instruction::result_id(is_y_max);
  cubesc_case_1 =
       InstructionBuilder::AddBinaryOp
                 ((InstructionBuilder *)&glsl405_ext_inst_id,AVar3,OpLogicalAnd,uVar4,uVar5);
  uVar4 = opt::Instruction::result_id(is_y_neg);
  uVar5 = opt::Instruction::result_id(ny);
  uVar6 = opt::Instruction::result_id(local_e8);
  cubesc_case_2 =
       InstructionBuilder::AddSelect
                 ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar4 = opt::Instruction::result_id(amax_x_y);
  uVar5 = opt::Instruction::result_id(local_158);
  uVar6 = opt::Instruction::result_id(ax);
  sel = InstructionBuilder::AddSelect
                  ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar4 = opt::Instruction::result_id(cubesc_case_1);
  uVar5 = opt::Instruction::result_id(local_e8);
  uVar6 = opt::Instruction::result_id(sel);
  cubesc = InstructionBuilder::AddSelect
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar4 = opt::Instruction::result_id(not_is_z_max);
  uVar5 = opt::Instruction::result_id(cubesc_case_2);
  uVar6 = opt::Instruction::result_id(cubesc);
  cubetc_case_1 =
       InstructionBuilder::AddSelect
                 ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar4 = opt::Instruction::result_id(is_x_neg);
  uVar5 = opt::Instruction::result_id(ax);
  uVar6 = opt::Instruction::result_id(local_158);
  cubetc = InstructionBuilder::AddSelect
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar4 = opt::Instruction::result_id(cubesc_case_1);
  uVar5 = opt::Instruction::result_id(cubetc);
  uVar6 = opt::Instruction::result_id(nz);
  cube = InstructionBuilder::AddSelect
                   ((InstructionBuilder *)&glsl405_ext_inst_id,uVar2,uVar4,uVar5,uVar6);
  uVar1 = ir_builder._28_4_;
  local_370 = opt::Instruction::result_id(cubetc_case_1);
  local_36c = opt::Instruction::result_id(cube);
  local_368 = &local_370;
  local_360 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&denom + 7));
  __l_00._M_len = local_360;
  __l_00._M_array = local_368;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_358,__l_00,(allocator_type *)((long)&denom + 7));
  pIVar8 = InstructionBuilder::AddCompositeConstruct
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,&local_358);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_358);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&denom + 7));
  uVar1 = ir_builder._28_4_;
  local_340 = pIVar8;
  local_3b0 = opt::Instruction::result_id(is_z_max);
  local_3ac = opt::Instruction::result_id(is_z_max);
  local_3a8 = &local_3b0;
  local_3a0 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&div + 7));
  __l._M_len = local_3a0;
  __l._M_array = local_3a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_398,__l,(allocator_type *)((long)&div + 7));
  pIVar8 = InstructionBuilder::AddCompositeConstruct
                     ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,&local_398);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_398);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&div + 7));
  uVar1 = ir_builder._28_4_;
  local_380 = pIVar8;
  uVar2 = opt::Instruction::result_id(local_340);
  uVar4 = opt::Instruction::result_id(local_380);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)InstructionBuilder::AddBinaryOp
                          ((InstructionBuilder *)&glsl405_ext_inst_id,uVar1,OpFDiv,uVar2,uVar4);
  opt::Instruction::SetOpcode(inst,OpFAdd);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_3d8);
  local_444 = opt::Instruction::result_id
                        ((Instruction *)
                         new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_440 = &local_444;
  local_438 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_440;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_430,init_list_00);
  Operand::Operand(&local_408,SPV_OPERAND_TYPE_ID,&local_430);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_3d8,
             &local_408);
  Operand::~Operand(&local_408);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_430);
  local_4b4 = (uint32_t)x;
  local_4b0 = &local_4b4;
  local_4a8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_4b0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_4a0,init_list);
  Operand::Operand(&local_478,SPV_OPERAND_TYPE_ID,&local_4a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_3d8,
             &local_478);
  Operand::~Operand(&local_478);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_4a0);
  opt::Instruction::SetInOperands(inst,(OperandList *)local_3d8);
  IRContext::UpdateDefUse(ctx,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_3d8);
  return true;
}

Assistant:

bool ReplaceCubeFaceCoord(IRContext* ctx, Instruction* inst,
                          const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  uint32_t float_type_id = type_mgr->GetFloatTypeId();
  const analysis::Type* v2_float_type = type_mgr->GetFloatVectorType(2);
  uint32_t v2_float_type_id = type_mgr->GetId(v2_float_type);
  uint32_t bool_id = type_mgr->GetBoolTypeId();

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t input_id = inst->GetSingleWordInOperand(2);
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  // Get the constants that will be used.
  uint32_t f0_const_id = const_mgr->GetFloatConstId(0.0);
  uint32_t f2_const_id = const_mgr->GetFloatConstId(2.0);
  uint32_t f0_5_const_id = const_mgr->GetFloatConstId(0.5);
  const analysis::Constant* vec_const =
      const_mgr->GetConstant(v2_float_type, {f0_5_const_id, f0_5_const_id});
  uint32_t vec_const_id =
      const_mgr->GetDefiningInstruction(vec_const)->result_id();

  // Extract the input values.
  Instruction* x = ir_builder.AddCompositeExtract(float_type_id, input_id, {0});
  Instruction* y = ir_builder.AddCompositeExtract(float_type_id, input_id, {1});
  Instruction* z = ir_builder.AddCompositeExtract(float_type_id, input_id, {2});

  // Negate the input values.
  Instruction* nx =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, x->result_id());
  Instruction* ny =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, y->result_id());
  Instruction* nz =
      ir_builder.AddUnaryOp(float_type_id, spv::Op::OpFNegate, z->result_id());

  // Get the abolsute values of the inputs.
  Instruction* ax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {x->result_id()});
  Instruction* ay = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {y->result_id()});
  Instruction* az = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FAbs, {z->result_id()});

  // Find which values are negative.  Used in later computations.
  Instruction* is_z_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, z->result_id(), f0_const_id);
  Instruction* is_y_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, y->result_id(), f0_const_id);
  Instruction* is_x_neg = ir_builder.AddBinaryOp(
      bool_id, spv::Op::OpFOrdLessThan, x->result_id(), f0_const_id);

  // Compute cubema
  Instruction* amax_x_y = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {ax->result_id(), ay->result_id()});
  Instruction* amax = ir_builder.AddNaryExtendedInstruction(
      float_type_id, glsl405_ext_inst_id, GLSLstd450FMax,
      {az->result_id(), amax_x_y->result_id()});
  Instruction* cubema = ir_builder.AddBinaryOp(float_type_id, spv::Op::OpFMul,
                                               f2_const_id, amax->result_id());

  // Do the comparisons needed for computing cubesc and cubetc.
  Instruction* is_z_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             az->result_id(), amax_x_y->result_id());
  Instruction* not_is_z_max = ir_builder.AddUnaryOp(
      bool_id, spv::Op::OpLogicalNot, is_z_max->result_id());
  Instruction* y_gr_x =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpFOrdGreaterThanEqual,
                             ay->result_id(), ax->result_id());
  Instruction* is_y_max =
      ir_builder.AddBinaryOp(bool_id, spv::Op::OpLogicalAnd,
                             not_is_z_max->result_id(), y_gr_x->result_id());

  // Select the correct value for cubesc.
  Instruction* cubesc_case_1 = ir_builder.AddSelect(
      float_type_id, is_z_neg->result_id(), nx->result_id(), x->result_id());
  Instruction* cubesc_case_2 = ir_builder.AddSelect(
      float_type_id, is_x_neg->result_id(), z->result_id(), nz->result_id());
  Instruction* sel =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(), x->result_id(),
                           cubesc_case_2->result_id());
  Instruction* cubesc =
      ir_builder.AddSelect(float_type_id, is_z_max->result_id(),
                           cubesc_case_1->result_id(), sel->result_id());

  // Select the correct value for cubetc.
  Instruction* cubetc_case_1 = ir_builder.AddSelect(
      float_type_id, is_y_neg->result_id(), nz->result_id(), z->result_id());
  Instruction* cubetc =
      ir_builder.AddSelect(float_type_id, is_y_max->result_id(),
                           cubetc_case_1->result_id(), ny->result_id());

  // Do the division
  Instruction* cube = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubesc->result_id(), cubetc->result_id()});
  Instruction* denom = ir_builder.AddCompositeConstruct(
      v2_float_type_id, {cubema->result_id(), cubema->result_id()});
  Instruction* div = ir_builder.AddBinaryOp(
      v2_float_type_id, spv::Op::OpFDiv, cube->result_id(), denom->result_id());

  // Get the final result by adding 0.5 to |div|.
  inst->SetOpcode(spv::Op::OpFAdd);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {div->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {vec_const_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}